

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

side_type helix::nasdaq::itch_side(char c)

{
  side_type sVar1;
  invalid_argument *this;
  int __val;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = buy;
  __val = (int)CONCAT71(in_register_00000039,c);
  if (__val != 0x42) {
    if (__val != 0x53) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"invalid argument: ","");
      std::__cxx11::to_string(&local_60,__val);
      std::operator+(&local_40,&local_80,&local_60);
      std::invalid_argument::invalid_argument(this,(string *)&local_40);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    sVar1 = sell;
  }
  return sVar1;
}

Assistant:

static side_type itch_side(char c)
{
    switch (c) {
    case 'B': return side_type::buy;
    case 'S': return side_type::sell;
    default:  throw invalid_argument(string("invalid argument: ") + to_string(c));
    }
}